

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O3

int cmsysProcess_SetPipeFile(cmsysProcess *cp,int prPipe,char *file)

{
  size_t sVar1;
  char *__dest;
  int iVar2;
  ulong uVar3;
  
  iVar2 = 0;
  if ((cp != (cmsysProcess *)0x0) && (iVar2 = 0, prPipe - 1U < 3)) {
    uVar3 = (ulong)(prPipe - 1U);
    if (*(void **)(cp->PipeNativeSTDIN + uVar3 * 2 + -9) != (void *)0x0) {
      free(*(void **)(cp->PipeNativeSTDIN + uVar3 * 2 + -9));
      (cp->PipeNativeSTDIN + uVar3 * 2 + -9)[0] = 0;
      (cp->PipeNativeSTDIN + uVar3 * 2 + -9)[1] = 0;
    }
    if (file != (char *)0x0) {
      sVar1 = strlen(file);
      __dest = (char *)malloc(sVar1 + 1);
      *(char **)(cp->PipeNativeSTDIN + uVar3 * 2 + -9) = __dest;
      if (__dest == (char *)0x0) {
        return 0;
      }
      strcpy(__dest,file);
      if (prPipe == 1) {
        cp->PipeNativeSTDIN[0] = -1;
        cp->PipeNativeSTDIN[1] = -1;
        cp->PipeSharedSTDIN = 0;
      }
      else if (prPipe == 2) {
        cp->PipeNativeSTDOUT[0] = -1;
        cp->PipeNativeSTDOUT[1] = -1;
        cp->PipeSharedSTDOUT = 0;
      }
      else {
        cp->PipeNativeSTDERR[0] = -1;
        cp->PipeNativeSTDERR[1] = -1;
        cp->PipeSharedSTDERR = 0;
      }
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int kwsysProcess_SetPipeFile(kwsysProcess* cp, int prPipe, const char* file)
{
  char** pfile;
  if(!cp)
    {
    return 0;
    }
  switch(prPipe)
    {
    case kwsysProcess_Pipe_STDIN: pfile = &cp->PipeFileSTDIN; break;
    case kwsysProcess_Pipe_STDOUT: pfile = &cp->PipeFileSTDOUT; break;
    case kwsysProcess_Pipe_STDERR: pfile = &cp->PipeFileSTDERR; break;
    default: return 0;
    }
  if(*pfile)
    {
    free(*pfile);
    *pfile = 0;
    }
  if(file)
    {
    *pfile = (char*)malloc(strlen(file)+1);
    if(!*pfile)
      {
      return 0;
      }
    strcpy(*pfile, file);
    }

  /* If we are redirecting the pipe, do not share it or use a native
     pipe.  */
  if(*pfile)
    {
    kwsysProcess_SetPipeNative(cp, prPipe, 0);
    kwsysProcess_SetPipeShared(cp, prPipe, 0);
    }
  return 1;
}